

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cpp
# Opt level: O2

void llvm::MD5::stringifyResult(MD5Result *Result,SmallString<32U> *Str)

{
  SmallString<32U> local_40;
  
  MD5Result::digest(&local_40,Result);
  SmallVectorImpl<char>::operator=((SmallVectorImpl<char> *)Str,(SmallVectorImpl<char> *)&local_40);
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&local_40);
  return;
}

Assistant:

void MD5::stringifyResult(MD5Result &Result, SmallString<32> &Str) {
  Str = Result.digest();
}